

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuLaunchData.cpp
# Opt level: O0

bool __thiscall xmrig::CpuLaunchData::isEqual(CpuLaunchData *this,CpuLaunchData *other)

{
  bool bVar1;
  long in_RSI;
  Assembly *in_RDI;
  Assembly *in_stack_ffffffffffffffd8;
  bool local_11;
  
  bVar1 = Assembly::operator==(in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if ((((bVar1) &&
       (local_11 = false, ((char)in_RDI[1].m_id & AUTO) == (*(byte *)(in_RSI + 4) & AUTO))) &&
      (local_11 = false, (*(byte *)((long)&in_RDI[1].m_id + 1) & 1) == (*(byte *)(in_RSI + 5) & 1)))
     && ((local_11 = false, in_RDI[8].m_id == *(Id *)(in_RSI + 0x20) &&
         (local_11 = false, in_RDI[2].m_id == *(Id *)(in_RSI + 8))))) {
    local_11 = *(long *)(in_RDI + 4) == *(long *)(in_RSI + 0x10);
  }
  return local_11;
}

Assistant:

bool xmrig::CpuLaunchData::isEqual(const CpuLaunchData &other) const
{
    return (assembly            == other.assembly
            && hugePages        == other.hugePages
            && hwAES            == other.hwAES
            && intensity        == other.intensity
            && priority         == other.priority
            && affinity         == other.affinity
            );
}